

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SupermapException.cpp
# Opt level: O0

void __thiscall
supermap::NotImplementedException::NotImplementedException
          (NotImplementedException *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = &local_90;
  std::__cxx11::string::string((string *)__lhs);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::empty();
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,in_RDI);
  SupermapException::SupermapException((SupermapException *)in_RDI,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&local_90);
  *(undefined ***)in_RDI = &PTR__NotImplementedException_00120888;
  return;
}

Assistant:

NotImplementedException::NotImplementedException(const std::string &message)
    : SupermapException(std::string() + "NotImplementedException" + (message.empty() ? "" : ": ") + message) {}